

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# any_executor.hpp
# Opt level: O3

void __thiscall
asio::execution::detail::any_executor_base::
execute<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
          (any_executor_base *this,
          binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *f)

{
  _func_void_any_executor_base_ptr_function_view *UNRECOVERED_JUMPTABLE;
  _func_void_any_executor_base_ptr_function_ptr *p_Var1;
  _Manager_type p_Var2;
  undefined8 *puVar3;
  non_const_lvalue<asio::detail::binder1<std::function<void_(const_std::error_code_&)>,_std::error_code>_>
  f2;
  function_view fVar4;
  bad_executor ex;
  allocator<void> local_51;
  executor_function local_50;
  _Any_data local_48;
  _Manager_type local_38;
  _Invoker_type local_30;
  undefined8 local_28;
  error_category *peStack_20;
  
  if (this->target_ == (void *)0x0) {
    local_50.impl_ = (impl_base *)&PTR__exception_004c4548;
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = &PTR__exception_004c4548;
    __cxa_throw(puVar3,&bad_executor::typeinfo,std::exception::~exception);
  }
  UNRECOVERED_JUMPTABLE = this->target_fns_->blocking_execute;
  if (UNRECOVERED_JUMPTABLE != (_func_void_any_executor_base_ptr_function_view *)0x0) {
    fVar4.function_ = f;
    fVar4.complete_ =
         asio::detail::executor_function_view::
         complete<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>>
    ;
    (*UNRECOVERED_JUMPTABLE)(this,fVar4);
    return;
  }
  p_Var1 = this->target_fns_->execute;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_38 = (_Manager_type)0x0;
  local_30 = (f->handler_)._M_invoker;
  p_Var2 = (f->handler_).super__Function_base._M_manager;
  if (p_Var2 != (_Manager_type)0x0) {
    local_48._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(f->handler_).super__Function_base._M_functor;
    local_48._8_8_ = *(undefined8 *)((long)&(f->handler_).super__Function_base._M_functor + 8);
    (f->handler_).super__Function_base._M_manager = (_Manager_type)0x0;
    (f->handler_)._M_invoker = (_Invoker_type)0x0;
    local_38 = p_Var2;
  }
  local_28 = *(undefined8 *)&f->arg1_;
  peStack_20 = (f->arg1_)._M_cat;
  asio::detail::executor_function::
  executor_function<asio::detail::binder1<std::function<void(std::error_code_const&)>,std::error_code>,std::allocator<void>>
            (&local_50,
             (binder1<std::function<void_(const_std::error_code_&)>,_std::error_code> *)&local_48,
             &local_51);
  (*p_Var1)(this,&local_50);
  if (local_50.impl_ != (impl_base *)0x0) {
    (*(local_50.impl_)->complete_)(local_50.impl_,false);
  }
  if (local_38 != (_Manager_type)0x0) {
    (*local_38)((_Any_data *)&local_48,(_Any_data *)&local_48,__destroy_functor);
  }
  return;
}

Assistant:

void execute(F&& f) const
  {
    if (target_)
    {
      if (target_fns_->blocking_execute != 0)
      {
        asio::detail::non_const_lvalue<F> f2(f);
        target_fns_->blocking_execute(*this, function_view(f2.value));
      }
      else
      {
        target_fns_->execute(*this,
            function(static_cast<F&&>(f), std::allocator<void>()));
      }
    }
    else
    {
      bad_executor ex;
      asio::detail::throw_exception(ex);
    }
  }